

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_config(unqlite *pDb,int nConfigOp,...)

{
  sxu32 sVar1;
  jx9 *pjVar2;
  sxi32 sVar3;
  int iVar4;
  uint uVar5;
  undefined8 *in_RDX;
  va_list ap;
  undefined8 *local_c8;
  uint *local_c0;
  
  if (pDb == (unqlite *)0x0) {
    return -0x18;
  }
  if (pDb->nMagic != 0xdb7c2712) {
    return -0x18;
  }
  iVar4 = -0xd;
  switch(nConfigOp) {
  case 1:
    if (in_RDX == (undefined8 *)0x0) {
      return -0x18;
    }
    pjVar2 = (pDb->sDB).pJx9;
    sVar1 = (pjVar2->xConf).sErrConsumer.nByte;
    sVar3 = SyBlobAppend(&(pjVar2->xConf).sErrConsumer,"",1);
    if (sVar3 == 0) {
      (pjVar2->xConf).sErrConsumer.nByte = sVar1;
    }
    *in_RDX = (pjVar2->xConf).sErrConsumer.pBlob;
    if (local_c0 != (uint *)0x0) {
      uVar5 = (pjVar2->xConf).sErrConsumer.nByte;
      if (uVar5 < 2) {
        uVar5 = 0;
      }
      *local_c0 = uVar5;
      return 0;
    }
    break;
  case 2:
    if ((int)(sxu32)local_c8 < 0x100) {
      return -9;
    }
    ((pDb->sDB).pPager)->nCacheMax = (sxu32)local_c8;
    break;
  case 3:
    if (in_RDX == (undefined8 *)0x0) {
      return -0x18;
    }
    sVar1 = (pDb->sErr).nByte;
    sVar3 = SyBlobAppend(&pDb->sErr,"",1);
    if (sVar3 == 0) {
      (pDb->sErr).nByte = sVar1;
    }
    *in_RDX = (pDb->sErr).pBlob;
    if (local_c0 != (uint *)0x0) {
      uVar5 = (pDb->sErr).nByte;
      if (uVar5 < 2) {
        *local_c0 = 0;
        return 0;
      }
      *local_c0 = uVar5;
      return 0;
    }
    return 0;
  default:
    goto switchD_0010b68d_caseD_4;
  case 5:
    *(byte *)&pDb->iFlags = (byte)pDb->iFlags | 1;
    break;
  case 6:
    iVar4 = 0;
    if (local_c8 != (undefined8 *)0x0) {
      *local_c8 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->zName;
      iVar4 = 0;
    }
    goto switchD_0010b68d_caseD_4;
  }
  iVar4 = 0;
switchD_0010b68d_caseD_4:
  return iVar4;
}

Assistant:

int unqlite_config(unqlite *pDb,int nConfigOp,...)
{
	va_list ap;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 va_start(ap, nConfigOp);
	 rc = unqliteConfigure(&(*pDb),nConfigOp, ap);
	 va_end(ap);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}